

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall BaseSocketImpl::BaseSocketImpl(BaseSocketImpl *this,BaseSocketImpl *pBaseSocket)

{
  atomic_uchar *paVar1;
  lock_guard<std::mutex> local_78;
  lock_guard<std::mutex> lock;
  BaseSocketImpl *local_60;
  offset_in_BaseSocketImpl_to_subr local_58 [2];
  type local_48;
  BaseSocketImpl *local_30;
  BaseSocketImpl *pBaseSocket_local;
  BaseSocketImpl *this_local;
  undefined4 local_18;
  __int_type_conflict local_11;
  atomic_uchar *local_10;
  
  this->_vptr_BaseSocketImpl = (_func_int **)&PTR__BaseSocketImpl_001b92c8;
  this->m_fSock = -1;
  local_30 = pBaseSocket;
  pBaseSocket_local = this;
  std::__cxx11::string::string((string *)&this->m_strName);
  std::thread::thread(&this->m_thListen);
  std::thread::thread(&this->m_thWrite);
  std::mutex::mutex(&this->m_mxWrite);
  std::thread::thread(&this->m_thClose);
  this->m_bStop = (bool)(local_30->m_bStop & 1);
  this->m_iError = local_30->m_iError;
  this->m_iErrLoc = local_30->m_iErrLoc;
  std::atomic<unsigned_char>::atomic(&this->m_iShutDownState,'\0');
  local_58[1] = 0;
  local_58[0] = 0x79;
  local_60 = this;
  std::bind<void(BaseSocketImpl::*)(),BaseSocketImpl*>(&local_48,local_58,&local_60);
  std::function<void(BaseSocket*)>::
  function<std::_Bind<void(BaseSocketImpl::*(BaseSocketImpl*))()>,void>
            ((function<void(BaseSocket*)> *)&this->m_fError,&local_48);
  std::function<void_(BaseSocket_*,_void_*)>::function(&this->m_fErrorParam);
  std::function<void_(BaseSocket_*)>::function(&this->m_fClosing);
  std::function<void_(BaseSocket_*,_void_*)>::function(&this->m_fClosingParam);
  this->m_pvUserData = local_30->m_pvUserData;
  std::mutex::mutex(&this->m_mxFnClosing);
  this->m_pBkRef = (BaseSocket *)0x0;
  std::lock_guard<std::mutex>::lock_guard(&local_78,&local_30->m_mxWrite);
  std::swap<int>(&this->m_fSock,&local_30->m_fSock);
  std::swap<void,BaseSocket*>(&this->m_fError,&local_30->m_fError);
  std::swap<void,BaseSocket*,void*>(&this->m_fErrorParam,&local_30->m_fErrorParam);
  std::swap<void,BaseSocket*>(&this->m_fClosing,&local_30->m_fClosing);
  std::swap<void,BaseSocket*,void*>(&this->m_fClosingParam,&local_30->m_fClosingParam);
  paVar1 = &this->m_iShutDownState;
  this_local._7_1_ =
       std::__atomic_base::operator_cast_to_unsigned_char
                 ((__atomic_base *)&local_30->m_iShutDownState);
  local_18 = 5;
  LOCK();
  this_local._6_1_ = (paVar1->super___atomic_base<unsigned_char>)._M_i;
  (paVar1->super___atomic_base<unsigned_char>)._M_i = this_local._7_1_;
  UNLOCK();
  local_11 = this_local._7_1_;
  local_10 = paVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_78);
  return;
}

Assistant:

BaseSocketImpl::BaseSocketImpl(BaseSocketImpl* pBaseSocket) : m_fSock(INVALID_SOCKET), m_bStop(pBaseSocket->m_bStop), m_iError(pBaseSocket->m_iError), m_iErrLoc(pBaseSocket->m_iErrLoc), m_iShutDownState(0), m_fError(bind(&BaseSocketImpl::OnError, this)), m_pvUserData(pBaseSocket->m_pvUserData), m_pBkRef(nullptr)
{
    lock_guard<mutex> lock(pBaseSocket->m_mxWrite);
    swap(m_fSock, pBaseSocket->m_fSock);
    swap(m_fError, pBaseSocket->m_fError);
    swap(m_fErrorParam, pBaseSocket->m_fErrorParam);
    swap(m_fClosing, pBaseSocket->m_fClosing);
    swap(m_fClosingParam, pBaseSocket->m_fClosingParam);
    m_iShutDownState.exchange(pBaseSocket->m_iShutDownState);
}